

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int patternCompare(u8 *zPattern,u8 *zString,compareInfo *pInfo,u32 matchOther)

{
  byte bVar1;
  byte bVar2;
  u8 uVar3;
  bool bVar4;
  uint uVar5;
  u32 uVar6;
  uint uVar7;
  uint uVar8;
  uchar *puVar9;
  size_t sVar10;
  u32 uVar11;
  bool bVar12;
  u8 *puVar13;
  u32 uVar14;
  byte *pbVar15;
  long in_FS_OFFSET;
  bool bVar16;
  u8 *local_58;
  byte *local_50;
  u8 *local_48;
  byte local_3b;
  uchar auStack_3a [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = pInfo->matchOne;
  uVar5 = (uint)bVar1;
  bVar2 = pInfo->matchAll;
  uVar3 = pInfo->noCase;
  local_58 = (u8 *)0x0;
  local_50 = zString;
  local_48 = zPattern;
LAB_00128e24:
  do {
    uVar14 = (u32)(char)*local_48;
    if ((char)*local_48 < '\0') {
      uVar14 = sqlite3Utf8Read(&local_48);
    }
    else {
      local_48 = local_48 + 1;
    }
    if (uVar14 == 0) {
      uVar8 = (uint)(*local_50 != 0);
      pbVar15 = local_50;
      goto LAB_00129226;
    }
    if (uVar14 == bVar2) {
      break;
    }
    if (uVar14 == matchOther) {
      if (pInfo->matchSet == '\0') {
        uVar14 = sqlite3Utf8Read(&local_48);
        if (uVar14 != 0) {
          local_58 = local_48;
          goto LAB_00128ef3;
        }
        uVar8 = 1;
        pbVar15 = local_50;
      }
      else {
        uVar14 = sqlite3Utf8Read(&local_50);
        uVar8 = 1;
        pbVar15 = local_50;
        if (uVar14 != 0) {
          uVar6 = sqlite3Utf8Read(&local_48);
          uVar11 = 0;
          bVar16 = uVar6 == 0x5e;
          if (bVar16) {
            uVar6 = sqlite3Utf8Read(&local_48);
          }
          bVar12 = false;
          if (uVar6 != 0x5d) goto LAB_00128f89;
          bVar12 = uVar14 == 0x5d;
LAB_00128f7b:
          uVar11 = 0;
LAB_00128f7d:
          uVar6 = sqlite3Utf8Read(&local_48);
LAB_00128f89:
          if (uVar6 == 0x2d) {
            if ((*local_48 != ']') && (uVar11 != 0 && *local_48 != '\0')) goto code_r0x00128fc7;
          }
          else {
            pbVar15 = local_50;
            if (uVar6 == 0x5d) {
              if (bVar12 == bVar16) goto LAB_00129226;
              goto LAB_00128e24;
            }
            if (uVar6 == 0) goto LAB_00129226;
          }
          uVar11 = uVar6;
          if (uVar14 == uVar6) {
            bVar12 = true;
          }
          goto LAB_00128f7d;
        }
      }
      goto LAB_00129226;
    }
LAB_00128ef3:
    uVar7 = (uint)(char)*local_50;
    if ((char)*local_50 < '\0') {
      uVar7 = sqlite3Utf8Read(&local_50);
    }
    else {
      local_50 = local_50 + 1;
    }
    if (((uVar14 != uVar7) &&
        (((uVar3 == '\0' || (0x7f < (uVar7 | uVar14))) || (""[uVar14 & 0xff] != ""[uVar7 & 0xff]))))
       && (((uVar8 = 1, pbVar15 = local_50, uVar14 != uVar5 || (uVar7 == 0)) ||
           (local_48 == local_58)))) goto LAB_00129226;
  } while( true );
  while ((uVar14 != uVar5 || (uVar14 = sqlite3Utf8Read(&local_50), uVar14 != 0))) {
    uVar14 = (u32)(char)*local_48;
    if ((char)*local_48 < '\0') {
      uVar14 = sqlite3Utf8Read(&local_48);
    }
    else {
      local_48 = local_48 + 1;
    }
    if ((uVar14 != bVar2) && (bVar1 == 0 || uVar14 != uVar5)) {
      pbVar15 = local_50;
      if (uVar14 == 0) {
        uVar8 = 0;
        goto LAB_00129226;
      }
      if (uVar14 == matchOther) {
        if (pInfo->matchSet != '\0') {
          puVar13 = local_48 + -1;
          uVar5 = 1;
          goto LAB_00129096;
        }
        uVar14 = sqlite3Utf8Read(&local_48);
        if (uVar14 == 0) break;
      }
      puVar13 = local_48;
      if (0x7f < uVar14) {
        goto LAB_00129153;
      }
      auStack_3a[1] = 0xaa;
      if (uVar3 == '\0') {
        puVar9 = auStack_3a;
        _local_3b = CONCAT11(0xaa,(byte)uVar14);
      }
      else {
        puVar9 = auStack_3a + 1;
        _local_3b = CONCAT11(""[uVar14],(byte)uVar14 & (~""[uVar14] | 0xdf));
      }
      *puVar9 = '\0';
      pbVar15 = local_50;
      goto LAB_001291d5;
    }
  }
  goto LAB_0012905f;
  while( true ) {
    uVar7 = patternCompare(puVar13,pbVar15,pInfo,matchOther);
    uVar8 = uVar7;
    if (uVar7 == 1) {
      uVar8 = uVar5;
      if (bVar1 < 0xc0) {
        pbVar15 = pbVar15 + 1;
      }
      else {
        pbVar15 = pbVar15 + 1;
      }
    }
    uVar5 = uVar8;
    if (uVar7 != 1) break;
LAB_00129096:
    bVar1 = *pbVar15;
    if (bVar1 == 0) {
      uVar8 = 2;
      break;
    }
  }
  goto LAB_00129226;
  while ((uVar11 != uVar14 ||
         (uVar8 = patternCompare(puVar13,local_50,pInfo,matchOther), uVar8 == 1))) {
LAB_00129153:
    uVar11 = (u32)(char)*local_50;
    if ((char)*local_50 < '\0') {
      uVar11 = sqlite3Utf8Read(&local_50);
    }
    else {
      local_50 = local_50 + 1;
    }
    if (uVar11 == 0) {
      uVar8 = 1;
      break;
    }
  }
  pbVar15 = local_50;
  if (uVar11 != 0) goto LAB_00129226;
  goto LAB_0012905f;
code_r0x00128fc7:
  uVar6 = sqlite3Utf8Read(&local_48);
  bVar4 = true;
  if (uVar6 < uVar14) {
    bVar4 = bVar12;
  }
  if (uVar11 <= uVar14) {
    bVar12 = bVar4;
  }
  goto LAB_00128f7b;
  while( true ) {
    pbVar15 = pbVar15 + sVar10 + 1;
    uVar8 = patternCompare(puVar13,pbVar15,pInfo,matchOther);
    if (uVar8 != 1) break;
LAB_001291d5:
    sVar10 = strcspn((char *)pbVar15,(char *)&local_3b);
    bVar1 = pbVar15[sVar10];
    if (bVar1 == 0) {
      uVar8 = 1;
      pbVar15 = pbVar15 + sVar10;
      break;
    }
  }
  local_50 = pbVar15;
  if (bVar1 != 0) goto LAB_00129226;
LAB_0012905f:
  uVar8 = 2;
  pbVar15 = local_50;
LAB_00129226:
  local_50 = pbVar15;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar8;
  }
  __stack_chk_fail();
}

Assistant:

static int patternCompare(
  const u8 *zPattern,              /* The glob pattern */
  const u8 *zString,               /* The string to compare against the glob */
  const struct compareInfo *pInfo, /* Information about how to do the compare */
  u32 matchOther                   /* The escape char (LIKE) or '[' (GLOB) */
){
  u32 c, c2;                       /* Next pattern and input string chars */
  u32 matchOne = pInfo->matchOne;  /* "?" or "_" */
  u32 matchAll = pInfo->matchAll;  /* "*" or "%" */
  u8 noCase = pInfo->noCase;       /* True if uppercase==lowercase */
  const u8 *zEscaped = 0;          /* One past the last escaped input char */

  while( (c = Utf8Read(zPattern))!=0 ){
    if( c==matchAll ){  /* Match "*" */
      /* Skip over multiple "*" characters in the pattern.  If there
      ** are also "?" characters, skip those as well, but consume a
      ** single character of the input string for each "?" skipped */
      while( (c=Utf8Read(zPattern)) == matchAll
             || (c == matchOne && matchOne!=0) ){
        if( c==matchOne && sqlite3Utf8Read(&zString)==0 ){
          return SQLITE_NOWILDCARDMATCH;
        }
      }
      if( c==0 ){
        return SQLITE_MATCH;   /* "*" at the end of the pattern matches */
      }else if( c==matchOther ){
        if( pInfo->matchSet==0 ){
          c = sqlite3Utf8Read(&zPattern);
          if( c==0 ) return SQLITE_NOWILDCARDMATCH;
        }else{
          /* "[...]" immediately follows the "*".  We have to do a slow
          ** recursive search in this case, but it is an unusual case. */
          assert( matchOther<0x80 );  /* '[' is a single-byte character */
          while( *zString ){
            int bMatch = patternCompare(&zPattern[-1],zString,pInfo,matchOther);
            if( bMatch!=SQLITE_NOMATCH ) return bMatch;
            SQLITE_SKIP_UTF8(zString);
          }
          return SQLITE_NOWILDCARDMATCH;
        }
      }

      /* At this point variable c contains the first character of the
      ** pattern string past the "*".  Search in the input string for the
      ** first matching character and recursively continue the match from
      ** that point.
      **
      ** For a case-insensitive search, set variable cx to be the same as
      ** c but in the other case and search the input string for either
      ** c or cx.
      */
      if( c<0x80 ){
        char zStop[3];
        int bMatch;
        if( noCase ){
          zStop[0] = sqlite3Toupper(c);
          zStop[1] = sqlite3Tolower(c);
          zStop[2] = 0;
        }else{
          zStop[0] = c;
          zStop[1] = 0;
        }
        while(1){
          zString += strcspn((const char*)zString, zStop);
          if( zString[0]==0 ) break;
          zString++;
          bMatch = patternCompare(zPattern,zString,pInfo,matchOther);
          if( bMatch!=SQLITE_NOMATCH ) return bMatch;
        }
      }else{
        int bMatch;
        while( (c2 = Utf8Read(zString))!=0 ){
          if( c2!=c ) continue;
          bMatch = patternCompare(zPattern,zString,pInfo,matchOther);
          if( bMatch!=SQLITE_NOMATCH ) return bMatch;
        }
      }
      return SQLITE_NOWILDCARDMATCH;
    }
    if( c==matchOther ){
      if( pInfo->matchSet==0 ){
        c = sqlite3Utf8Read(&zPattern);
        if( c==0 ) return SQLITE_NOMATCH;
        zEscaped = zPattern;
      }else{
        u32 prior_c = 0;
        int seen = 0;
        int invert = 0;
        c = sqlite3Utf8Read(&zString);
        if( c==0 ) return SQLITE_NOMATCH;
        c2 = sqlite3Utf8Read(&zPattern);
        if( c2=='^' ){
          invert = 1;
          c2 = sqlite3Utf8Read(&zPattern);
        }
        if( c2==']' ){
          if( c==']' ) seen = 1;
          c2 = sqlite3Utf8Read(&zPattern);
        }
        while( c2 && c2!=']' ){
          if( c2=='-' && zPattern[0]!=']' && zPattern[0]!=0 && prior_c>0 ){
            c2 = sqlite3Utf8Read(&zPattern);
            if( c>=prior_c && c<=c2 ) seen = 1;
            prior_c = 0;
          }else{
            if( c==c2 ){
              seen = 1;
            }
            prior_c = c2;
          }
          c2 = sqlite3Utf8Read(&zPattern);
        }
        if( c2==0 || (seen ^ invert)==0 ){
          return SQLITE_NOMATCH;
        }
        continue;
      }
    }
    c2 = Utf8Read(zString);
    if( c==c2 ) continue;
    if( noCase  && sqlite3Tolower(c)==sqlite3Tolower(c2) && c<0x80 && c2<0x80 ){
      continue;
    }
    if( c==matchOne && zPattern!=zEscaped && c2!=0 ) continue;
    return SQLITE_NOMATCH;
  }
  return *zString==0 ? SQLITE_MATCH : SQLITE_NOMATCH;
}